

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

bool __thiscall
SslUdpSocketImpl::CreateClientSide
          (SslUdpSocketImpl *this,char *szIpToWhere,uint16_t sPort,char *szDestAddr,char *szIpToBind
          )

{
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  *this_00;
  mutex *__mutex;
  atomic<unsigned_long> *paVar1;
  SslConnection *this_01;
  undefined8 __p;
  bool bVar2;
  int iResult;
  uint __val;
  size_t __n;
  pointer szBuffer;
  SSL *__val_00;
  unique_lock<std::mutex> lock;
  __array temp;
  size_t len;
  _Any_data local_100 [2];
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  wstring local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  wstring local_50;
  
  local_d8 = &this->m_strDestAddr;
  std::__cxx11::string::assign((char *)local_d8);
  bVar2 = UdpSocketImpl::Create(&this->super_UdpSocketImpl,szIpToWhere,sPort,szIpToBind);
  if (bVar2) {
    std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslUdpContext&>
              ((SslUdpContext *)local_100);
    __p = local_100[0]._M_unused._0_8_;
    this_00 = &this->m_pSslCon;
    local_100[0]._M_unused._M_object = (wchar_t *)0x0;
    std::
    __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
    ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)this_00,(pointer)__p);
    std::
    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
    ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 *)local_100);
    this_01 = (this->m_pSslCon)._M_t.
              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    local_d0._M_dataplus._M_p = (pointer)0x11;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_allocated_capacity = (size_type)this;
    std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslUdpSocketImpl*))()>,void>
              ((function<void()> *)local_100[0]._M_pod_data,
               (_Bind<void_(BaseSocketImpl::*(SslUdpSocketImpl_*))()> *)&local_d0);
    OpenSSLWrapper::SslConnection::SetErrorCb(this_01,(function<void_()> *)local_100);
    std::_Function_base::~_Function_base((_Function_base *)local_100);
    OpenSSLWrapper::SslConnection::SSLSetConnectState
              ((this_00->_M_t).
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    iResult = OpenSSLWrapper::SslConnection::SSLDoHandshake
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                        );
    if (iResult < 1) {
      __val = OpenSSLWrapper::SslConnection::SSLGetError
                        ((this_00->_M_t).
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,iResult);
      if (__val != 2) {
        (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = __val | 0x80000000;
        (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xf;
        std::__cxx11::to_wstring(&local_50,__val);
        std::operator+(&local_70,L"SSL_error after SSL_Handshake: ",&local_50);
        std::operator+(&local_b0,&local_70,L" on ssl context: ");
        __val_00 = OpenSSLWrapper::SslConnection::operator()
                             ((this_00->_M_t).
                              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                              _M_head_impl);
        std::__cxx11::to_wstring(&local_90,(unsigned_long)__val_00);
        std::operator+(&local_d0,&local_b0,&local_90);
        std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )local_100,&local_d0,L"\r\n");
        OutputDebugString((wchar_t *)local_100[0]._0_8_);
        std::__cxx11::wstring::~wstring((wstring *)local_100[0]._M_pod_data);
        std::__cxx11::wstring::~wstring((wstring *)&local_d0);
        std::__cxx11::wstring::~wstring((wstring *)&local_90);
        std::__cxx11::wstring::~wstring((wstring *)&local_b0);
        std::__cxx11::wstring::~wstring((wstring *)&local_70);
        std::__cxx11::wstring::~wstring((wstring *)&local_50);
        (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
        goto LAB_00110f34;
      }
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_100,&this->m_mxEnDecode);
    __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                    ((this->m_pSslCon)._M_t.
                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    __mutex = &(this->super_UdpSocketImpl).m_mxOutDeque;
    local_e0 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                *)&(this->super_UdpSocketImpl).m_quOutData;
    bVar2 = false;
    while (__n != 0) {
      szBuffer = (pointer)operator_new__(__n);
      memset(szBuffer,0,__n);
      local_d0._M_dataplus._M_p = szBuffer;
      local_b0._M_dataplus._M_p =
           (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                              ((this_00->_M_t).
                               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                               _M_head_impl,(uint8_t *)szBuffer,__n);
      if (local_b0._M_dataplus._M_p != (pointer)0x0) {
        std::mutex::lock(__mutex);
        LOCK();
        paVar1 = &(this->super_UdpSocketImpl).m_atOutBytes;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_b0._M_dataplus._M_p;
        UNLOCK();
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                  (local_e0,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            &local_d0,(unsigned_long *)&local_b0,local_d8);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        bVar2 = true;
      }
      __n = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this_00->_M_t).
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_d0);
    }
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_100);
    if (bVar2) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_100);
    bVar2 = true;
  }
  else {
LAB_00110f34:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SslUdpSocketImpl::CreateClientSide(const char* const szIpToWhere, const uint16_t sPort, const char* const szDestAddr, const char* const szIpToBind/* = nullptr*/)
{
    m_strDestAddr = szDestAddr;
    const bool bRet = UdpSocketImpl::Create(szIpToWhere, sPort, szIpToBind);
    if (bRet == true)
    {
        m_pSslCon = make_unique<SslConnection>(m_pUdpCtx);
        m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));

        //SSL_set_info_callback((*m_pSslCon)(), ssl_info_callbackClient);

        m_pSslCon->SSLSetConnectState();

        const int iSslInit = m_pSslCon->SSLDoHandshake();
        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 15;
                OutputDebugString(wstring(L"SSL_error after SSL_Handshake: " + to_wstring(iError) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                Close();
                return false;
            }
        }

        unique_lock<mutex> lock(m_mxEnDecode);
        bool bNewData = false;

        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }

        lock.unlock();

        if (bNewData == true)
            TriggerWriteThread();

    }
    return bRet;
}